

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O2

void doREPL(lua_State *L)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t size;
  char *pcVar5;
  size_t local_40;
  size_t lmsg;
  
  pcVar1 = progname;
  progname = (char *)0x0;
LAB_00107f4c:
  do {
    lua_settop(L,0);
    iVar2 = pushline(L,1);
    if (iVar2 == 0) {
LAB_0010816f:
      lua_settop(L,0);
      ravi_writeline(L);
      progname = pcVar1;
      return;
    }
    pcVar4 = lua_tolstring(L,-1,(size_t *)0x0);
    pcVar4 = lua_pushfstring(L,"return %s;",pcVar4);
    size = strlen(pcVar4);
    iVar2 = luaL_loadbufferx(L,pcVar4,size,"=stdin",(char *)0x0);
    if (iVar2 == 0) {
      lua_rotate(L,-2,-1);
      lua_settop(L,-2);
      iVar2 = 0;
    }
    else {
      lua_settop(L,-3);
      while( true ) {
        pcVar4 = lua_tolstring(L,1,&local_40);
        iVar2 = luaL_loadbufferx(L,pcVar4,local_40,"=stdin",(char *)0x0);
        if (((iVar2 != 3) || (pcVar4 = lua_tolstring(L,-1,&lmsg), lmsg < 5)) ||
           (iVar3 = strcmp(pcVar4 + (lmsg - 5),"<eof>"), iVar3 != 0)) break;
        lua_settop(L,-2);
        iVar3 = pushline(L,0);
        if (iVar3 == 0) break;
        lua_pushstring(L,anon_var_dwarf_115b5 + 5);
        lua_rotate(L,-2,1);
        lua_concat(L,3);
      }
    }
    lua_rotate(L,1,-1);
    lua_settop(L,-2);
    iVar3 = lua_gettop(L);
    if (iVar3 != 1) {
      __assert_fail("lua_gettop(L) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lua.c"
                    ,0x182,"int loadline(lua_State *)");
    }
    if (iVar2 == 0) {
      iVar2 = docall(L,0,-1);
      if (iVar2 == 0) {
        iVar2 = lua_gettop(L);
        if (0 < iVar2) {
          luaL_checkstack(L,0x14,"too many results to print");
          lua_getglobal(L,"print");
          lua_rotate(L,1,1);
          iVar2 = lua_pcallk(L,iVar2,0,0,0,(lua_KFunction)0x0);
          pcVar4 = progname;
          if (iVar2 != 0) {
            pcVar5 = lua_tolstring(L,-1,(size_t *)0x0);
            pcVar5 = lua_pushfstring(L,"error calling \'print\' (%s)",pcVar5);
            l_message(L,pcVar4,pcVar5);
          }
        }
        goto LAB_00107f4c;
      }
    }
    else if (iVar2 == -1) goto LAB_0010816f;
    report(L,iVar2);
  } while( true );
}

Assistant:

static void doREPL (lua_State *L) {
  int status;
  const char *oldprogname = progname;
  progname = NULL;  /* no 'progname' on errors in interactive mode */
  while ((status = loadline(L)) != -1) {
    if (status == LUA_OK)
      status = docall(L, 0, LUA_MULTRET);
    if (status == LUA_OK) l_print(L);
    else report(L, status);
  }
  lua_settop(L, 0);  /* clear stack */
  lua_writeline();
  progname = oldprogname;
}